

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-icount.h
# Opt level: O0

void gen_tb_start(TCGContext_conflict9 *tcg_ctx,TranslationBlock *tb)

{
  TCGLabel *pTVar1;
  TCGv_i32 ret;
  TCGv_i32 count;
  TranslationBlock *tb_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  pTVar1 = gen_new_label_tricore(tcg_ctx);
  tcg_ctx->exitreq_label = pTVar1;
  ret = tcg_temp_new_i32(tcg_ctx);
  tcg_gen_ld_i32(tcg_ctx,ret,tcg_ctx->cpu_env,-0x10);
  tcg_gen_brcondi_i32_tricore(tcg_ctx,TCG_COND_LT,ret,0,tcg_ctx->exitreq_label);
  tcg_temp_free_i32(tcg_ctx,ret);
  return;
}

Assistant:

static inline void gen_tb_start(TCGContext *tcg_ctx, TranslationBlock *tb)
{
    TCGv_i32 count;

    tcg_ctx->exitreq_label = gen_new_label(tcg_ctx);

    count = tcg_temp_new_i32(tcg_ctx);

    tcg_gen_ld_i32(tcg_ctx, count, tcg_ctx->cpu_env,
                   offsetof(ArchCPU, neg.icount_decr.u32) -
                   offsetof(ArchCPU, env));

    tcg_gen_brcondi_i32(tcg_ctx, TCG_COND_LT, count, 0, tcg_ctx->exitreq_label);

    tcg_temp_free_i32(tcg_ctx, count);
}